

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deepidselect.cpp
# Opt level: O2

void setIds(IDManifest *mfst,
           list<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
           *ids,char **matches,int numMatches,
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           *channelToPos)

{
  _Rb_tree_header *p_Var1;
  char *__s1;
  bool bVar2;
  __type _Var3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  _Rb_tree_node_base *p_Var7;
  _Rb_tree_node_base *p_Var8;
  long *plVar9;
  const_iterator cVar10;
  ostream *poVar11;
  _Rb_tree_node_base *p_Var12;
  const_iterator cVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  _Rb_tree_node_base *p_Var17;
  match m;
  string componentName;
  string matchString;
  
  std::__cxx11::
  list<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
  ::clear(ids);
  matchString.field_2._M_allocated_capacity = 0;
  matchString._M_dataplus._M_p = (pointer)&matchString;
  matchString._M_string_length = (size_type)&matchString;
  std::__cxx11::
  list<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
  ::push_back(ids,(value_type *)&matchString);
  std::__cxx11::_List_base<match,_std::allocator<match>_>::_M_clear
            ((_List_base<match,_std::allocator<match>_> *)&matchString);
  p_Var1 = &(channelToPos->_M_t)._M_impl.super__Rb_tree_header;
  uVar14 = 0;
  uVar16 = (ulong)(uint)numMatches;
  if (numMatches < 1) {
    uVar16 = uVar14;
  }
  do {
    if (uVar14 == uVar16) {
      return;
    }
    __s1 = matches[uVar14];
    iVar4 = strcmp(__s1,"--and");
    if (iVar4 == 0) {
      matchString.field_2._M_allocated_capacity = 0;
      matchString._M_dataplus._M_p = (pointer)&matchString;
      matchString._M_string_length = (size_type)&matchString;
      std::__cxx11::
      list<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
      ::push_back(ids,(value_type *)&matchString);
      std::__cxx11::_List_base<match,_std::allocator<match>_>::_M_clear
                ((_List_base<match,_std::allocator<match>_> *)&matchString);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&matchString,__s1,(allocator<char> *)&componentName);
      componentName._M_dataplus._M_p = (pointer)&componentName.field_2;
      componentName._M_string_length = 0;
      componentName.field_2._M_local_buf[0] = '\0';
      lVar5 = std::__cxx11::string::find((char)&matchString,0x3a);
      if (lVar5 != -1) {
        std::__cxx11::string::substr((ulong)&m,(ulong)&matchString);
        std::__cxx11::string::operator=((string *)&componentName,(string *)&m);
        std::__cxx11::string::~string((string *)&m);
        std::__cxx11::string::substr((ulong)&m,(ulong)&matchString);
        std::__cxx11::string::operator=((string *)&matchString,(string *)&m);
        std::__cxx11::string::~string((string *)&m);
      }
      lVar5 = std::__cxx11::string::find_first_not_of((char *)&matchString,0x1083e6);
      if (lVar5 == -1) {
        cVar10 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::find(&channelToPos->_M_t,&componentName);
        if ((_Rb_tree_header *)cVar10._M_node != p_Var1) {
          m.channel1 = cVar10._M_node[2]._M_color;
          m.id1 = std::__cxx11::stoi(&matchString,(size_t *)0x0,10);
          m.channel2 = -1;
          std::__cxx11::list<match,_std::allocator<match>_>::push_back
                    ((list<match,_std::allocator<match>_> *)
                     ((ids->
                      super__List_base<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
                      )._M_impl._M_node.super__List_node_base._M_prev + 1),&m);
        }
      }
      else {
        for (uVar15 = 0; uVar6 = Imf_3_4::IDManifest::size(), uVar15 < uVar6; uVar15 = uVar15 + 1) {
          Imf_3_4::IDManifest::operator[]((ulong)mfst);
          p_Var7 = (_Rb_tree_node_base *)Imf_3_4::IDManifest::ChannelGroupManifest::begin();
          while( true ) {
            Imf_3_4::IDManifest::operator[]((ulong)mfst);
            p_Var8 = (_Rb_tree_node_base *)Imf_3_4::IDManifest::ChannelGroupManifest::end();
            if (p_Var7 == p_Var8) break;
            for (uVar6 = 0;
                uVar6 < (ulong)((long)p_Var7[1]._M_left - (long)p_Var7[1]._M_parent >> 5);
                uVar6 = uVar6 + 1) {
              bVar2 = std::operator==(&componentName,"");
              if (bVar2) {
LAB_001056c8:
                lVar5 = std::__cxx11::string::find
                                  ((string *)(p_Var7[1]._M_parent + uVar6),(ulong)&matchString);
                if (lVar5 != -1) {
                  lVar5 = Imf_3_4::IDManifest::operator[]((ulong)mfst);
                  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)(lVar5 + 0x70),
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&Imf_3_4::IDManifest::ID_SCHEME_abi_cxx11_);
                  if (_Var3) {
                    Imf_3_4::IDManifest::operator[]((ulong)mfst);
                    lVar5 = Imf_3_4::IDManifest::ChannelGroupManifest::getChannels_abi_cxx11_();
                    for (p_Var8 = *(_Rb_tree_node_base **)(lVar5 + 0x18);
                        p_Var8 != (_Rb_tree_node_base *)(lVar5 + 8);
                        p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
                      cVar10 = std::
                               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                               ::find(&channelToPos->_M_t,(key_type *)(p_Var8 + 1));
                      if ((_Rb_tree_header *)cVar10._M_node != p_Var1) {
                        m.channel1 = cVar10._M_node[2]._M_color;
                        m.id1 = p_Var7[1]._M_color;
                        m.channel2 = -1;
                        std::__cxx11::list<match,_std::allocator<match>_>::push_back
                                  ((list<match,_std::allocator<match>_> *)
                                   ((ids->
                                    super__List_base<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
                                    )._M_impl._M_node.super__List_node_base._M_prev + 1),&m);
                        poVar11 = std::operator<<((ostream *)&std::cerr,"adding match ");
                        *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) =
                             *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) &
                             0xffffffb5 | 8;
                        poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
                        *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) =
                             *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) &
                             0xffffffb5 | 2;
                        poVar11 = std::operator<<(poVar11," for string ");
                        poVar11 = std::operator<<(poVar11,(string *)(p_Var7[1]._M_parent + uVar6));
                        poVar11 = std::operator<<(poVar11," in channel ");
                        poVar11 = (ostream *)
                                  std::ostream::operator<<
                                            ((ostream *)poVar11,cVar10._M_node[2]._M_color);
                        poVar11 = std::operator<<(poVar11,'(');
                        poVar11 = std::operator<<(poVar11,(string *)(cVar10._M_node + 1));
                        std::operator<<(poVar11,")\n");
                      }
                    }
                  }
                  else {
                    lVar5 = Imf_3_4::IDManifest::operator[]((ulong)mfst);
                    _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)(lVar5 + 0x70),
                                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&Imf_3_4::IDManifest::ID2_SCHEME_abi_cxx11_);
                    if (_Var3) {
                      Imf_3_4::IDManifest::operator[]((ulong)mfst);
                      lVar5 = Imf_3_4::IDManifest::ChannelGroupManifest::getChannels_abi_cxx11_();
                      p_Var8 = *(_Rb_tree_node_base **)(lVar5 + 0x18);
                      Imf_3_4::IDManifest::operator[]((ulong)mfst);
                      lVar5 = Imf_3_4::IDManifest::ChannelGroupManifest::getChannels_abi_cxx11_();
                      p_Var17 = (_Rb_tree_node_base *)(lVar5 + 8);
                      while (p_Var8 != p_Var17) {
                        p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
                        if (p_Var12 != p_Var17) {
                          cVar10 = std::
                                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                   ::find(&channelToPos->_M_t,(key_type *)(p_Var8 + 1));
                          cVar13 = std::
                                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                   ::find(&channelToPos->_M_t,(key_type *)(p_Var12 + 1));
                          if ((_Rb_tree_header *)cVar13._M_node != p_Var1 &&
                              (_Rb_tree_header *)cVar10._M_node != p_Var1) {
                            m.channel1 = cVar10._M_node[2]._M_color;
                            m.id1 = (uint32_t)*(undefined8 *)(p_Var7 + 1);
                            m.channel2 = cVar13._M_node[2]._M_color;
                            m.id2 = (uint32_t)((ulong)*(undefined8 *)(p_Var7 + 1) >> 0x20);
                            std::__cxx11::list<match,_std::allocator<match>_>::push_back
                                      ((list<match,_std::allocator<match>_> *)
                                       ((ids->
                                        super__List_base<std::__cxx11::list<match,_std::allocator<match>_>,_std::allocator<std::__cxx11::list<match,_std::allocator<match>_>_>_>
                                        )._M_impl._M_node.super__List_node_base._M_prev + 1),&m);
                            poVar11 = std::operator<<((ostream *)&std::cerr,"adding match ");
                            *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) =
                                 *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) &
                                 0xffffffb5 | 8;
                            poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
                            *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) =
                                 *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) &
                                 0xffffffb5 | 2;
                            poVar11 = std::operator<<(poVar11," for string ");
                            poVar11 = std::operator<<(poVar11,(string *)
                                                              (p_Var7[1]._M_parent + uVar6));
                            poVar11 = std::operator<<(poVar11,": ");
                            *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) =
                                 *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) &
                                 0xffffffb5 | 8;
                            poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
                            poVar11 = std::operator<<(poVar11," in channel ");
                            poVar11 = (ostream *)
                                      std::ostream::operator<<((ostream *)poVar11,m.channel1);
                            poVar11 = std::operator<<(poVar11,'(');
                            poVar11 = std::operator<<(poVar11,(string *)(cVar10._M_node + 1));
                            poVar11 = std::operator<<(poVar11,"), ");
                            *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) =
                                 *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) &
                                 0xffffffb5 | 8;
                            poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
                            poVar11 = std::operator<<(poVar11," in channel ");
                            poVar11 = (ostream *)
                                      std::ostream::operator<<((ostream *)poVar11,m.channel2);
                            poVar11 = std::operator<<(poVar11,'(');
                            poVar11 = std::operator<<(poVar11,(string *)(cVar13._M_node + 1));
                            std::operator<<(poVar11,")\n");
                          }
                          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
                          if (p_Var8 != p_Var17) {
                            p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
                          }
                        }
                      }
                    }
                  }
                }
              }
              else {
                Imf_3_4::IDManifest::operator[]((ulong)mfst);
                plVar9 = (long *)Imf_3_4::IDManifest::ChannelGroupManifest::getComponents_abi_cxx11_
                                           ();
                _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)(uVar6 * 0x20 + *plVar9),&componentName);
                if (_Var3) goto LAB_001056c8;
              }
            }
            p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
          }
        }
      }
      std::__cxx11::string::~string((string *)&componentName);
      std::__cxx11::string::~string((string *)&matchString);
    }
    uVar14 = uVar14 + 1;
  } while( true );
}

Assistant:

void
setIds (
    const IDManifest&       mfst,
    list<list<match>>&      ids,
    const char*             matches[],
    int                     numMatches,
    const map<string, int>& channelToPos)
{

    //
    // initially one single list
    //
    ids.clear ();
    ids.push_back (list<match> ());

    //
    // check each manifest, each entry, against each matching expression
    //
    for (int c = 0; c < numMatches; ++c)
    {

        //
        // an 'and' argument means proceed to the next group of ids
        // must find a match in every such group
        //
        if (strcmp (matches[c], "--and") == 0)
        {
            ids.push_back (list<match> ());
            continue;
        }

        string matchString (matches[c]);

        //
        // handle strings of the form component:searchstring
        // and channel:idnumber
        //
        string            componentName;
        string::size_type pos = matchString.find (':');
        if (pos != string::npos)
        {
            componentName = matchString.substr (0, pos);
            matchString   = matchString.substr (pos + 1);
        }

        if (matchString.find_first_not_of ("0123456789") == string::npos)
        {
            map<string, int>::const_iterator chan =
                channelToPos.find (componentName);
            if (chan != channelToPos.end ())
            {
                match m;
                m.channel1 = chan->second;
                m.id1      = stoi (matchString);
                m.channel2 = -1;
                ids.back ().push_back (m);
            }
            continue; // skip parsing the manifests for this string
        }

        // check the manifest for each group of channels
        for (size_t i = 0; i < mfst.size (); ++i)
        {

            for (IDManifest::ChannelGroupManifest::ConstIterator it =
                     mfst[i].begin ();
                 it != mfst[i].end ();
                 ++it)
            {
                for (size_t stringIndex = 0; stringIndex < it.text ().size ();
                     ++stringIndex)
                {
                    if (componentName == "" ||
                        mfst[i].getComponents ()[stringIndex] == componentName)
                    {
                        // simple substring matching only: could do wildcards or regexes here instead
                        if (it.text ()[stringIndex].find (matchString) !=
                            string::npos)
                        {
                            // a match is found - add it to the corresponding channels
                            if (mfst[i].getEncodingScheme () ==
                                IDManifest::ID_SCHEME)
                            {
                                // simple scheme: the ID channel has to match
                                for (const string& s: mfst[i].getChannels ())
                                {
                                    map<string, int>::const_iterator chan =
                                        channelToPos.find (s);
                                    if (chan != channelToPos.end ())
                                    {
                                        //could support matching the ID against a specific channel
                                        //that check would happen here

                                        match m;
                                        m.channel1 = chan->second;
                                        m.id1      = uint32_t (it.id ());
                                        m.channel2 = -1;
                                        ids.back ().push_back (m);
                                        cerr << "adding match " << hex
                                             << it.id () << dec
                                             << " for string "
                                             << it.text ()[stringIndex]
                                             << " in channel " << chan->second
                                             << '(' << chan->first << ")\n";
                                    }
                                }
                            }
                            else if (
                                mfst[i].getEncodingScheme () ==
                                IDManifest::ID2_SCHEME)
                            {
                                // 64 bit IDs are spread across two channels, with the least significant bits
                                // in the first channel (alphabetically) and the most significant bits in the second
                                // so process the channel set in pairs

                                set<string>::const_iterator chanLow =
                                    mfst[i].getChannels ().begin ();
                                set<string>::const_iterator end =
                                    mfst[i].getChannels ().end ();

                                while (chanLow != end)
                                {
                                    set<string>::const_iterator chanHigh =
                                        chanLow;
                                    ++chanHigh;

                                    if (chanHigh != end)
                                    {
                                        map<string, int>::const_iterator
                                            chanIdxLow =
                                                channelToPos.find (*chanLow);
                                        map<string, int>::const_iterator
                                            chanIdxHigh =
                                                channelToPos.find (*chanHigh);

                                        if (chanIdxLow != channelToPos.end () &&
                                            chanIdxHigh != channelToPos.end ())
                                        {
                                            // to match against specific channels, check at least one channel matches here
                                            match m;
                                            m.channel1 = chanIdxLow->second;
                                            m.id1      = it.id () & 0xFFFFFFFF;
                                            m.channel2 = chanIdxHigh->second;
                                            m.id2      = it.id () >> 32;
                                            ids.back ().push_back (m);

                                            cerr << "adding match " << hex
                                                 << it.id () << dec
                                                 << " for string "
                                                 << it.text ()[stringIndex]
                                                 << ": " << hex << m.id1
                                                 << " in channel " << m.channel1
                                                 << '(' << chanIdxLow->first
                                                 << "), " << hex << m.id2
                                                 << " in channel " << m.channel2
                                                 << '(' << chanIdxHigh->first
                                                 << ")\n";
                                        }

                                        ++chanLow;
                                        if (chanLow != end) { ++chanLow; }
                                    }
                                }
                            }
                        }
                    }
                }
            }
        }
    }
}